

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

Matrix<float,_3,_3,_0,_3,_3> *
getSkew<float>(Matrix<float,_3,_3,_0,_3,_3> *__return_storage_ptr__,Matrix<float,_3,_1,_0,_3,_1> *v)

{
  Scalar *pSVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *pCVar2;
  Scalar local_5c;
  Scalar local_58;
  Scalar local_54;
  Scalar local_50 [4];
  Scalar local_40;
  Scalar local_3c;
  CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> local_38;
  Matrix<float,_3,_1,_0,_3,_1> *local_18;
  Matrix<float,_3,_1,_0,_3,_1> *v_local;
  Matrix<float,_3,_3,_0,_3,_3> *sV;
  
  local_18 = v;
  v_local = (Matrix<float,_3,_1,_0,_3,_1> *)__return_storage_ptr__;
  Eigen::Matrix<float,_3,_3,_0,_3,_3>::Matrix(__return_storage_ptr__);
  local_3c = 0.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator<<
            (&local_38,(DenseBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)__return_storage_ptr__,
             &local_3c);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)v,2);
  local_40 = -*pSVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (&local_38,&local_40);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)v,1);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,pSVar1);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)v,2);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,pSVar1);
  local_50[0] = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,local_50)
  ;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)v,0);
  local_54 = -*pSVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_54);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)v,1);
  local_58 = -*pSVar1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar2,&local_58);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1> *)v,0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,pSVar1);
  local_5c = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::operator_(pCVar2,&local_5c);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Matrix<floatPrec, 3, 3> getSkew(Matrix<floatPrec, 3, 1> v)
{

  Matrix<floatPrec, 3, 3> sV;
  sV << 0, -v(2), v(1),
      v(2), 0, -v(0),
      -v(1), v(0), 0;

  return sV;
}